

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_connect<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          endpoint_type *peer_endpoint,anon_class_8_1_8991fb9c *handler)

{
  undefined1 is_continuation_00;
  reactive_socket_connect_op<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9)>
  *addr;
  reactor_op *in_RCX;
  base_implementation_type *in_RDX;
  reactive_socket_service_base *in_RSI;
  ptr p;
  bool is_continuation;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  socket_type socket;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  reactive_socket_connect_op<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9)>
  *addrlen;
  
  socket = (socket_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  is_continuation_00 =
       asio_handler_cont_helpers::
       is_continuation<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0>
                 ((anon_class_8_1_8991fb9c *)0x1ab705);
  addr = reactive_socket_connect_op<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9)>
         ::ptr::allocate((anon_class_8_1_8991fb9c *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  addrlen = addr;
  reactive_socket_connect_op<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9)>
  ::reactive_socket_connect_op
            ((reactive_socket_connect_op<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9)>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),socket,
             in_stack_ffffffffffffff80);
  asio::ip::basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)0x1ab778);
  asio::ip::basic_endpoint<asio::ip::tcp>::size((basic_endpoint<asio::ip::tcp> *)0x1ab789);
  reactive_socket_service_base::start_connect_op
            (in_RSI,in_RDX,in_RCX,(bool)is_continuation_00,(socket_addr_type *)addr,(size_t)addrlen)
  ;
  reactive_socket_connect_op<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9)>
  ::ptr::~ptr((ptr *)0x1ab7d4);
  return;
}

Assistant:

void async_connect(implementation_type& impl,
      const endpoint_type& peer_endpoint, Handler& handler)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_connect_op<Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(impl.socket_, handler);

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_connect"));

    start_connect_op(impl, p.p, is_continuation,
        peer_endpoint.data(), peer_endpoint.size());
    p.v = p.p = 0;
  }